

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.cpp
# Opt level: O3

void __thiscall
geometrycentral::MarkedDisjointSets::MarkedDisjointSets(MarkedDisjointSets *this,size_t n_)

{
  ulong *puVar1;
  pointer puVar2;
  pointer puVar3;
  _Bit_type *p_Var4;
  byte bVar5;
  ulong in_RAX;
  size_t i;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uStack_28;
  
  this->n = n_;
  uStack_28 = in_RAX;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->parent,n_ + 1,(allocator_type *)((long)&uStack_28 + 6));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->rank,this->n + 1,(allocator_type *)((long)&uStack_28 + 5));
  uStack_28 = uStack_28 & 0xffffffffffffff;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->marked,this->n + 1,(bool *)((long)&uStack_28 + 7),
             (allocator_type *)((long)&uStack_28 + 4));
  puVar2 = (this->rank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->parent).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var4 = (this->marked).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar6 = 0;
  do {
    puVar2[uVar6] = 0;
    puVar3[uVar6] = uVar6;
    uVar7 = uVar6 + 0x3f;
    if (-1 < (long)uVar6) {
      uVar7 = uVar6;
    }
    uVar8 = uVar6 & 0x800000000000003f;
    bVar5 = (byte)uVar6 & 0x3f;
    uVar6 = uVar6 + 1;
    puVar1 = p_Var4 + ((long)uVar7 >> 6) + (ulong)(uVar8 < 0x8000000000000001) + 0xffffffffffffffff;
    *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
  } while (uVar6 <= this->n);
  return;
}

Assistant:

MarkedDisjointSets::MarkedDisjointSets(size_t n_) : n(n_), parent(n + 1), rank(n + 1), marked(n + 1) {
  // Initialize all elements to be in different sets and to have rank 0
  for (size_t i = 0; i <= n; i++) {
    rank[i] = 0;
    parent[i] = i;
    marked[i] = false;
  }
}